

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtering.cpp
# Opt level: O1

void Image_Function::Prewitt
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uchar *puVar6;
  long lVar7;
  imageException *this;
  ulong uVar8;
  uchar *puVar9;
  uint uVar10;
  uint uVar11;
  EVP_PKEY_CTX *src;
  uint uVar12;
  uchar *__s;
  long lVar13;
  uchar *puVar14;
  uchar *puVar15;
  uint uVar16;
  uchar *puVar17;
  uchar *puVar18;
  ulong uVar19;
  uchar *puVar20;
  uchar *puVar21;
  uchar *puVar22;
  uint uVar23;
  uchar *puVar24;
  uint uVar25;
  ulong uVar26;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00201be8;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if ((2 < width) && (2 < height)) {
    uVar26 = (ulong)(startXIn != 0);
    uVar10 = startXIn + 1 + width;
    uVar2 = in->_width;
    uVar3 = in->_height;
    uVar11 = startYIn + 1 + height;
    uVar16 = (startXIn != 0 | 0xfffffffe) + width + (uint)(uVar10 < uVar2);
    uVar4 = out->_rowSize;
    __s = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar4);
    uVar5 = in->_rowSize;
    uVar8 = (ulong)uVar5;
    puVar6 = in->_data;
    if (startYIn == 0) {
      memset(__s,0,(ulong)width);
      __s = __s + uVar4;
    }
    uVar25 = (height + (startYIn != 0) + (uint)(uVar11 < uVar3) + -2) * uVar5;
    if (Prewitt(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)
        ::kernel == '\0') {
      Prewitt();
    }
    if (uVar25 != 0) {
      uVar19 = (ulong)(((startYIn + 1) - (uint)(startYIn != 0)) * uVar5);
      lVar7 = (uVar19 + startXIn) - uVar26;
      puVar9 = puVar6 + lVar7 + 1;
      lVar13 = startXIn - uVar26;
      lVar1 = lVar13 + uVar19;
      puVar15 = puVar6 + lVar1 + uVar8 + 1;
      lVar13 = uVar19 + 1 + lVar13;
      puVar18 = puVar6 + (lVar13 - uVar8);
      puVar20 = puVar6 + lVar1;
      puVar21 = puVar6 + (lVar13 - (ulong)(uVar5 - 1));
      puVar22 = puVar6 + (ulong)(uVar5 - 1) + lVar1 + 1;
      puVar14 = puVar6 + lVar1 + (ulong)(uVar5 + 1) + 1;
      puVar17 = puVar6 + (lVar13 - (ulong)(uVar5 + 1));
      do {
        puVar24 = __s;
        if (startXIn == 0) {
          *__s = '\0';
          puVar24 = __s + 1;
        }
        if (uVar16 != 0) {
          uVar26 = 0;
          do {
            uVar23 = ((uint)puVar20[uVar26] + (uint)puVar22[uVar26] +
                     ((uint)puVar17[uVar26] - (uint)puVar14[uVar26])) -
                     ((uint)puVar20[uVar26 + 2] + (uint)puVar21[uVar26]);
            uVar12 = ((uint)puVar18[uVar26] + (uint)puVar21[uVar26] +
                     (((uint)puVar17[uVar26] - (uint)puVar14[uVar26]) - (uint)puVar22[uVar26])) -
                     (uint)puVar15[uVar26];
            uVar5 = -uVar23;
            if (0 < (int)uVar23) {
              uVar5 = uVar23;
            }
            uVar23 = -uVar12;
            if (0 < (int)uVar12) {
              uVar23 = uVar12;
            }
            puVar24[uVar26] = Prewitt::kernel.kernel[uVar5][uVar23];
            uVar26 = uVar26 + 1;
          } while (uVar16 != uVar26);
          puVar24 = puVar24 + uVar26;
        }
        if (uVar2 <= uVar10) {
          *puVar24 = '\0';
        }
        puVar9 = puVar9 + uVar8;
        __s = __s + uVar4;
        puVar15 = puVar15 + uVar8;
        puVar18 = puVar18 + uVar8;
        puVar20 = puVar20 + uVar8;
        puVar21 = puVar21 + uVar8;
        puVar22 = puVar22 + uVar8;
        puVar14 = puVar14 + uVar8;
        puVar17 = puVar17 + uVar8;
      } while (puVar9 != puVar6 + (ulong)uVar25 + lVar7 + 1);
    }
    if (uVar3 <= uVar11) {
      memset(__s,0,(ulong)width);
    }
    return;
  }
  this = (imageException *)__cxa_allocate_exception(0x28);
  imageException::imageException(this,"Input image is very small for Sobel filter to be applied");
  __cxa_throw(this,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

void Prewitt( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                  uint32_t width, uint32_t height )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );

        if( width < 3 || height < 3 )
            throw imageException( "Input image is very small for Sobel filter to be applied" );

        const uint32_t startXOffset = (startXIn > 0u) ? 1u : 0u;
        const uint32_t startYOffset = (startYIn > 0u) ? 1u : 0u;
        const uint32_t endXOffset   = ((startXIn + width  + 1u) < in.width ()) ? 1u : 0u;
        const uint32_t endYOffset   = ((startYIn + height + 1u) < in.height()) ? 1u : 0u;

        // Create the map of gradient values
        const uint32_t gradientWidth  = width  - ( ((startXOffset > 0u) ? 0u : 1u) + ((endXOffset > 0u) ? 0u : 1u) );
        const uint32_t gradientHeight = height - ( ((startYOffset > 0u) ? 0u : 1u) + ((endYOffset > 0u) ? 0u : 1u) );

        const float multiplier = 1.0f / ( 3.0f * sqrtf( 2.0f ) );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + (startYIn + 1u - startYOffset) * rowSizeIn + startXIn + 1u - startXOffset;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * inYEnd = inY + gradientHeight * rowSizeIn;

        if ( startYOffset == 0u ) {
            // fill top row with zeros
            memset( outY, 0, width );
            outY += rowSizeOut;
        }

        const uint32_t yPlusX  = rowSizeIn + 1u;
        const uint32_t yMinusX = rowSizeIn - 1u;

        static const FilterKernel<3u> kernel(multiplier);

        for( ; inY != inYEnd; inY += rowSizeIn, outY += rowSizeOut ) {
            uint8_t       * outX   = outY;

            if ( startXOffset == 0u ) {
                // set first pixel in row to 0
                *outX = 0;
                ++outX;
            }

            const uint8_t * inX    = inY;
            const uint8_t * inXEnd = inX + gradientWidth;

            for( ; inX != inXEnd; ++inX, ++outX ) {
                //      | +1  0 -1|
                // Gx = | +1  0 -1|
                //      | +1  0 -1|

                //      | +1 +1 +1|
                // Gy = |  0  0  0|
                //      | -1 -1 -1|

                const int32_t partialG = static_cast<int32_t>(*(inX - yPlusX )) - *(inX + yPlusX );  // [y - 1; x - 1] - [y + 1; x + 1]

                const int32_t gX = partialG + *(inX - 1        ) + *(inX + yMinusX) - *(inX - yMinusX) - *(inX + 1        );
                const int32_t gY = partialG + *(inX - rowSizeIn) + *(inX - yMinusX) - *(inX + yMinusX) - *(inX + rowSizeIn);

                *outX = kernel.kernel[(gX < 0) ? -gX : gX][(gY < 0) ? -gY : gY];
            }

            if ( endXOffset == 0u ) {
                // set last pixel in row to 0
                *outX = 0;
            }
        }

        if ( endYOffset == 0u ) {
            // fill bottom row with zeros
            memset( outY, 0, width );
        }
    }